

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (ValueVectorOf<unsigned_int> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  uint *t;
  uint *puVar2;
  uint *data;
  XMLSize_t i;
  XMLSize_t vectorSize;
  XSerializeEngine *serEng_local;
  ValueVectorOf<unsigned_int> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (uint *)ValueVectorOf<unsigned_int>::size(objToStore);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (uint *)0x0; data < t; data = (uint *)((long)data + 1)) {
      puVar2 = ValueVectorOf<unsigned_int>::elementAt(objToStore,(XMLSize_t)data);
      XSerializeEngine::operator<<(serEng,*puVar2);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(ValueVectorOf<unsigned int>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorSize = objToStore->size();
        serEng.writeSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            unsigned int& data = objToStore->elementAt(i);
            serEng<<data;
        }
    }
}